

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O3

void __thiscall
icu_63::CollationRuleParser::parseRuleChain(CollationRuleParser *this,UErrorCode *errorCode)

{
  short sVar1;
  UnicodeString *pUVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int32_t iVar6;
  char16_t *pcVar7;
  char *pcVar8;
  int i;
  uint uVar9;
  
  uVar4 = parseResetAndPosition(this,errorCode);
  uVar5 = parseRelationOperator(this,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    bVar3 = true;
    do {
      if ((int)uVar5 < 0) {
        pUVar2 = this->rules;
        sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar5 = (pUVar2->fUnion).fFields.fLength;
        }
        else {
          uVar5 = (int)sVar1 >> 5;
        }
        uVar9 = this->ruleIndex;
        if (uVar9 < uVar5 && (int)uVar9 < (int)uVar5) {
          if (((int)sVar1 & 2U) == 0) {
            pcVar7 = (pUVar2->fUnion).fFields.fArray;
          }
          else {
            pcVar7 = (char16_t *)((long)&pUVar2->fUnion + 2);
          }
          if (pcVar7[(int)uVar9] == L'#') {
            iVar6 = skipComment(this,uVar9 + 1);
            this->ruleIndex = iVar6;
            goto LAB_0024b54c;
          }
        }
        if (!bVar3) {
          return;
        }
        *errorCode = U_INVALID_FORMAT_ERROR;
        pcVar8 = "reset not followed by a relation";
LAB_0024b59d:
        this->errorReason = pcVar8;
        if (this->parseError == (UParseError *)0x0) {
          return;
        }
        setErrorContext(this);
        return;
      }
      uVar9 = uVar5 & 0xf;
      if ((int)uVar4 < 0xf) {
        if (bVar3) {
          if (uVar9 != uVar4) {
            *errorCode = U_INVALID_FORMAT_ERROR;
            pcVar8 = "reset-before strength differs from its first relation";
            goto LAB_0024b59d;
          }
        }
        else if ((int)uVar9 < (int)uVar4) {
          *errorCode = U_INVALID_FORMAT_ERROR;
          pcVar8 = "reset-before strength followed by a stronger relation";
          goto LAB_0024b59d;
        }
      }
      i = (uVar5 >> 8) + this->ruleIndex;
      if ((uVar5 & 0x10) == 0) {
        parseRelationStrings(this,uVar9,i,errorCode);
      }
      else {
        parseStarredCharacters(this,uVar9,i,errorCode);
      }
      if (U_ZERO_ERROR < *errorCode) {
        return;
      }
      bVar3 = false;
LAB_0024b54c:
      uVar5 = parseRelationOperator(this,errorCode);
    } while (*errorCode < U_ILLEGAL_ARGUMENT_ERROR);
  }
  return;
}

Assistant:

void
CollationRuleParser::parseRuleChain(UErrorCode &errorCode) {
    int32_t resetStrength = parseResetAndPosition(errorCode);
    UBool isFirstRelation = TRUE;
    for(;;) {
        int32_t result = parseRelationOperator(errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(result < 0) {
            if(ruleIndex < rules->length() && rules->charAt(ruleIndex) == 0x23) {
                // '#' starts a comment, until the end of the line
                ruleIndex = skipComment(ruleIndex + 1);
                continue;
            }
            if(isFirstRelation) {
                setParseError("reset not followed by a relation", errorCode);
            }
            return;
        }
        int32_t strength = result & STRENGTH_MASK;
        if(resetStrength < UCOL_IDENTICAL) {
            // reset-before rule chain
            if(isFirstRelation) {
                if(strength != resetStrength) {
                    setParseError("reset-before strength differs from its first relation", errorCode);
                    return;
                }
            } else {
                if(strength < resetStrength) {
                    setParseError("reset-before strength followed by a stronger relation", errorCode);
                    return;
                }
            }
        }
        int32_t i = ruleIndex + (result >> OFFSET_SHIFT);  // skip over the relation operator
        if((result & STARRED_FLAG) == 0) {
            parseRelationStrings(strength, i, errorCode);
        } else {
            parseStarredCharacters(strength, i, errorCode);
        }
        if(U_FAILURE(errorCode)) { return; }
        isFirstRelation = FALSE;
    }
}